

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::_::
CopyConstructArray_<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  while (this->start < this->pos) {
    this_00 = this->pos + -1;
    this->pos = this_00;
    ::std::__cxx11::string::~string((string *)this_00);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }